

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathObjectPtr xmlXPathObjectCopy(xmlXPathObjectPtr val)

{
  undefined4 uVar1;
  xmlXPathObjectPtr pxVar2;
  xmlNodeSetPtr pxVar3;
  xmlChar *pxVar4;
  long lVar5;
  xmlXPathObjectPtr pxVar6;
  xmlXPathObjectPtr pxVar7;
  byte bVar8;
  
  bVar8 = 0;
  if ((val == (xmlXPathObjectPtr)0x0) ||
     (pxVar2 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48), pxVar2 == (xmlXPathObjectPtr)0x0))
  goto LAB_001b0516;
  pxVar6 = val;
  pxVar7 = pxVar2;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    uVar1 = *(undefined4 *)&pxVar6->field_0x4;
    pxVar7->type = pxVar6->type;
    *(undefined4 *)&pxVar7->field_0x4 = uVar1;
    pxVar6 = (xmlXPathObjectPtr)((long)pxVar6 + (ulong)bVar8 * -0x10 + 8);
    pxVar7 = (xmlXPathObjectPtr)((long)pxVar7 + (ulong)bVar8 * -0x10 + 8);
  }
  switch(val->type) {
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    pxVar3 = xmlXPathNodeSetMerge((xmlNodeSetPtr)0x0,val->nodesetval);
    pxVar2->nodesetval = pxVar3;
    if (pxVar3 != (xmlNodeSetPtr)0x0) {
      pxVar2->boolval = 0;
      return pxVar2;
    }
    break;
  case XPATH_BOOLEAN:
  case XPATH_NUMBER:
    goto switchD_001b04d2_caseD_2;
  case XPATH_STRING:
    pxVar4 = xmlStrdup(val->stringval);
    pxVar2->stringval = pxVar4;
    if (pxVar4 != (xmlChar *)0x0) {
      return pxVar2;
    }
    break;
  case XPATH_USERS:
    pxVar2->user = val->user;
    goto switchD_001b04d2_caseD_2;
  }
  (*xmlFree)(pxVar2);
LAB_001b0516:
  pxVar2 = (xmlXPathObjectPtr)0x0;
switchD_001b04d2_caseD_2:
  return pxVar2;
}

Assistant:

xmlXPathObjectPtr
xmlXPathObjectCopy(xmlXPathObjectPtr val) {
    xmlXPathObjectPtr ret;

    if (val == NULL)
	return(NULL);

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL)
	return(NULL);
    memcpy(ret, val , sizeof(xmlXPathObject));
    switch (val->type) {
	case XPATH_BOOLEAN:
	case XPATH_NUMBER:
	    break;
	case XPATH_STRING:
	    ret->stringval = xmlStrdup(val->stringval);
            if (ret->stringval == NULL) {
                xmlFree(ret);
                return(NULL);
            }
	    break;
	case XPATH_XSLT_TREE:
	case XPATH_NODESET:
	    ret->nodesetval = xmlXPathNodeSetMerge(NULL, val->nodesetval);
            if (ret->nodesetval == NULL) {
                xmlFree(ret);
                return(NULL);
            }
	    /* Do not deallocate the copied tree value */
	    ret->boolval = 0;
	    break;
        case XPATH_USERS:
	    ret->user = val->user;
	    break;
        default:
            xmlFree(ret);
            ret = NULL;
	    break;
    }
    return(ret);
}